

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,uint64_t v0,bool specialized)

{
  bool specialized_local;
  uint64_t v0_local;
  SPIRConstant *this_local;
  TypeID constant_type__local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_01410ee8;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_.id;
  ConstantMatrix::ConstantMatrix(&this->m);
  this->specialization = specialized;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  this->is_null_array_specialized_length = false;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::SmallVector
            (&this->subconstants);
  ::std::__cxx11::string::string((string *)&this->specialization_constant_macro_name);
  (this->m).c[0].r[0].u64 = v0;
  (this->m).c[0].vecsize = 1;
  (this->m).columns = 1;
  return;
}

Assistant:

SPIRConstant(TypeID constant_type_, uint64_t v0, bool specialized)
	    : constant_type(constant_type_)
	    , specialization(specialized)
	{
		m.c[0].r[0].u64 = v0;
		m.c[0].vecsize = 1;
		m.columns = 1;
	}